

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSharedConstructorCode
          (MessageGenerator *this,Printer *p)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Printer *pPVar2;
  long *plVar3;
  Options *in_RCX;
  long lVar4;
  long alStack_258 [4];
  variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
  vStack_238;
  long alStack_210 [3];
  anon_class_1_0_00000001 local_1f1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1f0;
  undefined1 local_1e8 [9];
  undefined7 uStack_1df;
  undefined8 uStack_1d8;
  undefined1 *local_1d0;
  undefined8 local_1c8;
  undefined1 local_1c0;
  undefined7 uStack_1bf;
  undefined8 uStack_1b8;
  Printer *local_1b0;
  Printer *local_1a8;
  string local_1a0;
  undefined8 *local_180;
  undefined8 uStack_178;
  code *local_170;
  code *local_168;
  undefined1 local_160;
  undefined1 *local_158;
  undefined8 local_150;
  undefined1 local_148 [16];
  undefined1 local_138;
  undefined1 local_f0;
  undefined1 *local_e8;
  undefined8 local_e0;
  undefined1 local_d8 [8];
  undefined8 uStack_d0;
  undefined8 *local_c8;
  undefined8 uStack_c0;
  code *local_b8;
  code *local_b0;
  undefined1 local_a8;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90 [16];
  undefined1 local_80;
  undefined1 local_38;
  
  alStack_210[2] = 0x20b5cf;
  local_1b0 = p;
  SimpleBaseClass_abi_cxx11_
            (&local_1a0,(cpp *)this->descriptor_,(Descriptor *)&this->options_,in_RCX);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    alStack_210[2] = 0x20b5ed;
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  pPVar2 = local_1b0;
  if (local_1a0._M_string_length == 0) {
    paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_1e8 + 8);
    alStack_210[2] = 0x20b61c;
    local_1f0 = paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"init_impl","");
    if (local_1f0 == paVar1) {
      local_1a0.field_2._8_8_ = uStack_1d8;
      local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
    }
    else {
      local_1a0._M_dataplus._M_p = (pointer)local_1f0;
    }
    local_1a8 = pPVar2;
    local_1a0._M_string_length = local_1e8._0_8_;
    local_1e8._0_8_ = 0;
    local_1e8[8] = 0;
    alStack_210[2] = 0x20b671;
    local_1f0 = paVar1;
    local_180 = (undefined8 *)operator_new(0x18);
    *local_180 = this;
    local_180[1] = &local_1b0;
    *(undefined1 *)(local_180 + 2) = 0;
    local_168 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                ::_M_invoke;
    uStack_178 = 0;
    local_170 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                ::_M_manager;
    local_160 = 1;
    local_158 = local_148;
    local_150 = 0;
    local_148[0] = 0;
    local_138 = 0;
    alStack_210[2] = 0x20b6e8;
    std::__cxx11::string::_M_replace((ulong)&local_158,0,(char *)0x0,0x36a4ec);
    local_f0 = 0;
    alStack_210[2] = 0x20b716;
    local_1d0 = &local_1c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"zero_init","");
    local_e8 = local_d8;
    if (local_1d0 == &local_1c0) {
      uStack_d0 = uStack_1b8;
    }
    else {
      local_e8 = local_1d0;
    }
    local_e0 = local_1c8;
    local_1c8 = 0;
    local_1c0 = 0;
    alStack_210[2] = 0x20b774;
    local_1d0 = &local_1c0;
    local_c8 = (undefined8 *)operator_new(0x18);
    *local_c8 = this;
    local_c8[1] = &local_1b0;
    *(undefined1 *)(local_c8 + 2) = 0;
    local_b0 = std::
               _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
               ::_M_invoke;
    uStack_c0 = 0;
    local_b8 = std::
               _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
               ::_M_manager;
    local_a8 = 1;
    local_a0 = local_90;
    local_98 = 0;
    local_90[0] = 0;
    local_80 = 0;
    alStack_210[2] = 0x20b7f0;
    std::__cxx11::string::_M_replace((ulong)&local_a0,0,(char *)0x0,0x36a4ec);
    local_38 = 0;
    alStack_210[2] = 0x20b817;
    google::protobuf::io::Printer::Emit
              (local_1a8,&local_1a0,2,0x197,
               "\n            inline PROTOBUF_NDEBUG_INLINE $classname$::Impl_::Impl_(\n                $pbi$::InternalVisibility visibility,\n                ::$proto_ns$::Arena* arena)\n                //~\n                $init_impl$ {}\n\n            inline void $classname$::SharedCtor(::_pb::Arena* arena) {\n              new (&_impl_) Impl_(internal_visibility(), arena);\n              $zero_init$;\n            }\n          "
              );
    lVar4 = 0x170;
    do {
      if (*(char *)((long)&local_1a8 + lVar4) == '\x01') {
        alStack_210[2] = 0x20b83e;
        std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                  ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                   (local_1e8 + lVar4));
      }
      plVar3 = (long *)((long)alStack_210 + lVar4 + 0x10);
      if (plVar3 != *(long **)((long)alStack_210 + lVar4)) {
        alStack_210[2] = 0x20b85a;
        operator_delete(*(long **)((long)alStack_210 + lVar4),*plVar3 + 1);
      }
      alStack_210[2] = 0x20b86d;
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
        ::_S_vtable._M_arr[*(byte *)((long)alStack_210 + lVar4 + -8)]._M_data)
                (&local_1f1,
                 (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                  *)((long)&vStack_238.
                            super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                            .
                            super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                            .
                            super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                            .
                            super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                            .
                            super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                            .
                            super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                    + lVar4));
      plVar3 = (long *)((long)alStack_258 + lVar4 + 0x10);
      *(undefined1 *)((long)alStack_210 + lVar4 + -8) = 0xff;
      if (plVar3 != *(long **)((long)alStack_258 + lVar4)) {
        alStack_210[2] = 0x20b88d;
        operator_delete(*(long **)((long)alStack_258 + lVar4),*plVar3 + 1);
      }
      lVar4 = lVar4 + -0xb8;
    } while (lVar4 != 0);
    if (local_1d0 != &local_1c0) {
      alStack_210[2] = 0x20b8ad;
      operator_delete(local_1d0,CONCAT71(uStack_1bf,local_1c0) + 1);
    }
    if (local_1f0 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_1e8 + 8)) {
      alStack_210[2] = 0x20b8c9;
      operator_delete(local_1f0,CONCAT71(uStack_1df,local_1e8[8]) + 1);
    }
  }
  return;
}

Assistant:

void MessageGenerator::GenerateSharedConstructorCode(io::Printer* p) {
  if (HasSimpleBaseClass(descriptor_, options_)) return;

  // Generate Impl_::Imp_(visibility, Arena*);
  p->Emit({{"init_impl", [&] { GenerateImplMemberInit(p, InitType::kArena); }},
           {"zero_init", [&] { GenerateZeroInitFields(p); }}},
          R"cc(
            inline PROTOBUF_NDEBUG_INLINE $classname$::Impl_::Impl_(
                $pbi$::InternalVisibility visibility,
                ::$proto_ns$::Arena* arena)
                //~
                $init_impl$ {}

            inline void $classname$::SharedCtor(::_pb::Arena* arena) {
              new (&_impl_) Impl_(internal_visibility(), arena);
              $zero_init$;
            }
          )cc");
}